

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_thread_pool.h
# Opt level: O1

void __thiscall simple_thread_pool::ThreadPoolMgr::loop(ThreadPoolMgr *this)

{
  size_t *psVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  pthread_t __target_thread;
  size_t time_us;
  uint64_t next_sleep_us;
  shared_ptr<simple_thread_pool::TaskHandle> task_to_run;
  ThreadHandle *local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_60;
  ulong local_58;
  TaskResult local_4c;
  ThreadPoolMgrBase local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  
  __target_thread = pthread_self();
  pthread_setname_np(__target_thread,"stp_coord");
  local_58 = this->MAX_SLEEP_US;
  if (((this->stopSignal)._M_base._M_i & 1U) == 0) {
    do {
      psVar1 = &(this->myOpt).busyWaitingIntervalUs;
      time_us = local_58 - *psVar1;
      if (*psVar1 <= local_58 && time_us != 0) {
        EventAwaiter::wait_us(&this->eaLoop,time_us);
      }
      if (((this->stopSignal)._M_base._M_i & 1U) != 0) {
        return;
      }
      LOCK();
      (this->eaLoop).status._M_i = idle;
      UNLOCK();
      local_58 = this->MAX_SLEEP_US;
      local_68 = (ThreadHandle *)0x0;
      p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if ((this->myOpt).numInitialThreads == 0) {
LAB_00103cf0:
        (*(this->super_ThreadPoolMgrBase)._vptr_ThreadPoolMgrBase[4])
                  ((ThreadPoolMgr *)&stack0xffffffffffffffb8,this,&local_58);
        if ((ThreadHandle *)local_48._vptr_ThreadPoolMgrBase == (ThreadHandle *)0x0) {
          if (local_68 != (ThreadHandle *)0x0) {
            (*(this->super_ThreadPoolMgrBase)._vptr_ThreadPoolMgrBase[2])(this,&local_68);
          }
        }
        else if ((this->myOpt).numInitialThreads == 0) {
          local_4c.val = OK;
          TaskHandle::execute((TaskHandle *)local_48._vptr_ThreadPoolMgrBase,&local_4c);
        }
        else {
          ThreadHandle::assign
                    (local_68,(shared_ptr<simple_thread_pool::TaskHandle> *)&stack0xffffffffffffffb8
                    );
        }
        if (p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
        }
      }
      else {
        popThread((ThreadPoolMgr *)&stack0xffffffffffffffb8);
        p_Var2 = p_Stack_40;
        local_68 = (ThreadHandle *)local_48._vptr_ThreadPoolMgrBase;
        this_00 = p_Stack_60;
        local_48._vptr_ThreadPoolMgrBase = (_func_int **)0x0;
        p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        p_Stack_60 = p_Var2;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        if (p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
        }
        if (local_68 != (ThreadHandle *)0x0) goto LAB_00103cf0;
      }
      if (p_Stack_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_60);
      }
    } while (((this->stopSignal)._M_base._M_i & 1U) == 0);
  }
  return;
}

Assistant:

void loop() {
#ifdef __linux__
        pthread_setname_np(pthread_self(), "stp_coord");
#endif
        uint64_t next_sleep_us = MAX_SLEEP_US;

        while (!stopSignal) {
            if (next_sleep_us > myOpt.busyWaitingIntervalUs) {
                eaLoop.wait_us(next_sleep_us - myOpt.busyWaitingIntervalUs);
            } else {
                // Otherwise: busy waiting.
            }
            if (stopSignal) break;

            eaLoop.reset();
            next_sleep_us = MAX_SLEEP_US;

            std::shared_ptr<ThreadHandle> thread_to_assign = nullptr;

            if (myOpt.numInitialThreads) {
                // Thread pool exists, pick an idle thread.
                thread_to_assign = popThread();
                if (!thread_to_assign) {
                    // All threads are busy, skip.
                    continue;
                }
            }
            // Otherwise (empty thread pool),
            // this loop thread will do execution.

            // Check timer task first (higher priority).
            std::shared_ptr<TaskHandle> task_to_run = getTaskToRun(&next_sleep_us);

            if (!task_to_run) {
                // No task to run, skip.
                if (thread_to_assign) {
                    // Return the thread to idle list.
                    returnThread(thread_to_assign);
                }
                continue;
            }

            if (myOpt.numInitialThreads) {
                // Assign the task to picked thread.
                thread_to_assign->assign(task_to_run);
            } else {
                // Empty thread pool, execute here.
                task_to_run->execute(TaskResult());
            }
        }
    }